

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O2

void cf_curve25519_mul(uint8_t *q,uint8_t *n,uint8_t *p)

{
  size_t i;
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint8_t z [32];
  gf m;
  gf c;
  gf t;
  gf a;
  gf x;
  gf f;
  gf d;
  gf b;
  gf e;
  
  for (lVar1 = 0; lVar1 != 0x1f; lVar1 = lVar1 + 1) {
    z[lVar1] = n[lVar1];
  }
  z[0x1f] = n[0x1f] & 0x3f | 0x40;
  z[0] = z[0] & 0xf8;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    x[lVar1] = (ulong)*(ushort *)(p + lVar1 * 2);
  }
  x[0xf] = x[0xf] & 0x7fff;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    c[lVar1] = 0;
    b[lVar1] = x[lVar1];
    a[lVar1] = 0;
    d[lVar1] = 0;
  }
  d[0] = 1;
  a[0] = 1;
  for (uVar3 = 0xfe; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar4 = (ulong)((z[uVar3 >> 3] >> (uVar3 & 7) & 1) != 0);
    sel25519(a,b,uVar4);
    sel25519(c,d,uVar4);
    add(e,a,c);
    sub(a,a,c);
    add(c,b,d);
    sub(b,b,d);
    sqr(d,e);
    sqr(f,a);
    mul(a,c,a);
    mul(c,b,e);
    add(e,a,c);
    sub(a,a,c);
    sqr(b,a);
    sub(c,d,f);
    mul(a,c,_121665);
    add(a,a,d);
    mul(c,c,a);
    mul(a,d,f);
    mul(d,b,x);
    sqr(b,e);
    sel25519(a,b,uVar4);
    sel25519(c,d,uVar4);
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    m[lVar1] = c[lVar1];
  }
  for (iVar5 = 0xfd; -1 < iVar5; iVar5 = iVar5 + -1) {
    sqr(m,m);
    if ((iVar5 != 2) && (iVar5 != 4)) {
      mul(m,m,c);
    }
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    c[lVar1] = m[lVar1];
  }
  mul(a,a,c);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    t[lVar1] = a[lVar1];
  }
  car25519(t);
  car25519(t);
  car25519(t);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    uVar4 = t[0] - 0xffed;
    m[0] = uVar4;
    for (lVar2 = 1; lVar2 != 0xf; lVar2 = lVar2 + 1) {
      uVar6 = uVar4 & 0xffff;
      uVar4 = (((long)(uVar4 << 0x2f) >> 0x3f) + t[lVar2]) - 0xffff;
      m[lVar2] = uVar4;
      m[lVar2 + -1] = uVar6;
    }
    m[0xf] = t[0xf] + ((m[0xe] << 0x2f) >> 0x3f) + -0x7fff;
    m[0xe] = m[0xe] & 0xffff;
    sel25519(t,m,(ulong)(((uint)m[0xf] >> 0x10 & 1) == 0));
  }
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    *(short *)(q + lVar1 * 2) = (short)t[lVar1];
  }
  return;
}

Assistant:

void cf_curve25519_mul(uint8_t *q, const uint8_t *n, const uint8_t *p)
{
  uint8_t z[32];
  gf x;
  gf a, b, c, d, e, f;

  {
  size_t i;
  for (i = 0; i < 31; i++)
    z[i] = n[i];
  z[31] = (n[31] & 127) | 64;
  z[0] &= 248;
  
  unpack25519(x, p);

  for(i = 0; i < 16; i++)
  {
    b[i] = x[i];
    d[i] = a[i] = c[i] = 0;
  }
  }

  a[0] = d[0] = 1;

  {int i;
  for (i = 254; i >= 0; i--)
  {
    int64_t r = (z[i >> 3] >> (i & 7)) & 1;
    sel25519(a, b, r);
    sel25519(c, d, r);
    add(e, a, c);
    sub(a, a, c);
    add(c, b, d);
    sub(b, b, d);
    sqr(d, e);
    sqr(f, a);
    mul(a, c, a);
    mul(c, b, e);
    add(e, a, c);
    sub(a, a, c);
    sqr(b, a);
    sub(c, d, f);
    mul(a, c, _121665);
    add(a, a, d);
    mul(c, c, a);
    mul(a, d, f);
    mul(d, b, x);
    sqr(b, e);
    sel25519(a, b, r);
    sel25519(c, d, r);
  }
  }

  inv25519(c, c);
  mul(a, a, c);
  pack25519(q, a);
}